

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  CallInfo *ci;
  undefined8 uVar4;
  Proto *p;
  StkId pTVar5;
  long lVar6;
  undefined4 uVar7;
  byte bVar8;
  int iVar9;
  char *pcVar10;
  Table *t;
  uint uVar11;
  StkId pTVar12;
  Table *x_;
  char *pcVar13;
  CallInfo *ci_00;
  char *pcVar14;
  long lVar15;
  lua_CFunction p_Var16;
  ulong uStack_80;
  int local_74;
  Value local_40;
  int local_38;
  
  swapextra(L);
  if (*what == '>') {
    pTVar12 = L->top + -1;
    what = what + 1;
    L->top = pTVar12;
    ci_00 = (CallInfo *)0x0;
  }
  else {
    ci_00 = ar->i_ci;
    pTVar12 = ci_00->func;
  }
  if ((pTVar12->tt_ & 0x1fU) == 6) {
    p_Var16 = (pTVar12->value_).f;
  }
  else {
    p_Var16 = (lua_CFunction)0x0;
  }
  local_74 = 1;
  pcVar14 = what;
  do {
    cVar1 = *pcVar14;
    switch(cVar1) {
    case 'l':
      iVar9 = -1;
      if ((ci_00 != (CallInfo *)0x0) && ((ci_00->callstatus & 2) != 0)) {
        iVar9 = currentline(ci_00);
      }
      ar->currentline = iVar9;
      break;
    case 'm':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
switchD_00107623_caseD_6d:
      local_74 = 0;
      break;
    case 'n':
      if (ci_00 == (CallInfo *)0x0) goto switchD_001077f7_caseD_9;
      pcVar13 = "__gc";
      pcVar10 = "metamethod";
      if ((ci_00->callstatus >> 8 & 1) != 0) goto switchD_001077f7_caseD_29;
      if ((ci_00->callstatus & 0x20) != 0) goto switchD_001077f7_caseD_9;
      ci = ci_00->previous;
      uVar2 = ci->callstatus;
      if ((uVar2 & 2) == 0) goto switchD_001077f7_caseD_9;
      p = *(Proto **)((ci->func->value_).f + 0x18);
      iVar9 = currentpc(ci);
      pcVar13 = "?";
      pcVar10 = "hook";
      if ((uVar2 & 4) != 0) goto switchD_001077f7_caseD_29;
      uVar3 = p->code[iVar9];
      uVar11 = uVar3 & 0x3f;
      pcVar10 = "for iterator";
      pcVar13 = "for iterator";
      switch(uVar11) {
      case 6:
      case 7:
      case 0xc:
        uStack_80 = 0;
        break;
      case 8:
      case 10:
        uStack_80 = 1;
        break;
      default:
        goto switchD_001077f7_caseD_9;
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
        uStack_80 = (ulong)(uVar11 - 7);
        break;
      case 0x19:
        uStack_80 = 0x12;
        break;
      case 0x1a:
        uStack_80 = 0x13;
        break;
      case 0x1c:
        uStack_80 = 4;
        break;
      case 0x1d:
        uStack_80 = 0x16;
        break;
      case 0x1f:
        uStack_80 = 5;
        break;
      case 0x20:
        uStack_80 = 0x14;
        break;
      case 0x21:
        uStack_80 = 0x15;
        break;
      case 0x24:
      case 0x25:
        pcVar13 = getobjname(p,iVar9,uVar3 >> 6 & 0xff,&ar->name);
        ar->namewhat = pcVar13;
        if (pcVar13 != (char *)0x0) goto LAB_00107869;
        goto switchD_001077f7_caseD_9;
      case 0x29:
        goto switchD_001077f7_caseD_29;
      }
      pcVar13 = (char *)(L->l_G->tmname[uStack_80] + 1);
      pcVar10 = "metamethod";
switchD_001077f7_caseD_29:
      ar->name = pcVar13;
      ar->namewhat = pcVar10;
      break;
    case 't':
      if (ci_00 == (CallInfo *)0x0) {
        bVar8 = 0;
      }
      else {
        bVar8 = (byte)ci_00->callstatus & 0x20;
      }
      ar->istailcall = bVar8;
      break;
    case 'u':
      if (p_Var16 == (lua_CFunction)0x0) {
        ar->nups = '\0';
      }
      else {
        ar->nups = (uchar)p_Var16[10];
        if (p_Var16[8] != (_func_int_lua_State_ptr)0x26) {
          ar->isvararg = *(char *)(*(long *)(p_Var16 + 0x18) + 0xb);
          ar->nparams = *(uchar *)(*(long *)(p_Var16 + 0x18) + 10);
          break;
        }
      }
      ar->nparams = '\0';
      ar->isvararg = '\x01';
      break;
    default:
      if (cVar1 != 'L') {
        if (cVar1 == 'S') {
          if ((p_Var16 == (lua_CFunction)0x0) || (p_Var16[8] == (_func_int_lua_State_ptr)0x26)) {
            pcVar13 = "=[C]";
            ar->source = "=[C]";
            ar->linedefined = -1;
            ar->lastlinedefined = -1;
            pcVar10 = "C";
          }
          else {
            lVar6 = *(long *)(p_Var16 + 0x18);
            lVar15 = *(long *)(lVar6 + 0x68);
            pcVar13 = (char *)(lVar15 + 0x18);
            if (lVar15 == 0) {
              pcVar13 = "=?";
            }
            ar->source = pcVar13;
            uVar4 = *(undefined8 *)(lVar6 + 0x28);
            ar->linedefined = (int)uVar4;
            ar->lastlinedefined = (int)((ulong)uVar4 >> 0x20);
            pcVar10 = "Lua";
            if ((int)uVar4 == 0) {
              pcVar10 = "main";
            }
          }
          ar->what = pcVar10;
          luaO_chunkid(ar->short_src,pcVar13,0x3c);
        }
        else if (cVar1 != 'f') {
          if (cVar1 == '\0') {
            pcVar14 = strchr(what,0x66);
            if (pcVar14 != (char *)0x0) {
              pTVar5 = L->top;
              iVar9 = pTVar12->tt_;
              uVar7 = *(undefined4 *)&pTVar12->field_0xc;
              pTVar5->value_ = pTVar12->value_;
              pTVar5->tt_ = iVar9;
              *(undefined4 *)&pTVar5->field_0xc = uVar7;
              L->top = L->top + 1;
            }
            swapextra(L);
            pcVar14 = strchr(what,0x4c);
            if (pcVar14 != (char *)0x0) {
              if ((p_Var16 == (lua_CFunction)0x0) || (p_Var16[8] == (_func_int_lua_State_ptr)0x26))
              {
                pTVar12 = L->top;
                pTVar12->tt_ = 0;
                L->top = pTVar12 + 1;
              }
              else {
                lVar6 = *(long *)(*(long *)(p_Var16 + 0x18) + 0x48);
                t = luaH_new(L);
                pTVar12 = L->top;
                (pTVar12->value_).gc = (GCObject *)t;
                pTVar12->tt_ = 0x45;
                L->top = L->top + 1;
                local_40.b = 1;
                local_38 = local_40.b;
                for (lVar15 = 0; lVar15 < *(int *)(*(long *)(p_Var16 + 0x18) + 0x1c);
                    lVar15 = lVar15 + 1) {
                  luaH_setint(L,t,(long)*(int *)(lVar6 + lVar15 * 4),(TValue *)&local_40);
                }
              }
            }
            return local_74;
          }
          goto switchD_00107623_caseD_6d;
        }
      }
    }
LAB_00107869:
    pcVar14 = pcVar14 + 1;
  } while( true );
switchD_001077f7_caseD_9:
  ar->namewhat = "";
  ar->name = (char *)0x0;
  goto LAB_00107869;
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  StkId func;
  lua_lock(L);
  swapextra(L);
  if (*what == '>') {
    ci = NULL;
    func = L->top - 1;
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = ci->func;
    lua_assert(ttisfunction(ci->func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobjs2s(L, L->top, func);
    api_incr_top(L);
  }
  swapextra(L);  /* correct before option 'L', which can raise a mem. error */
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}